

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O2

void QUnicodeTools::Tailored::tibetanAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  lVar2 = 0;
  do {
    lVar1 = len - lVar2;
    if (lVar1 == 0 || len < lVar2) {
      return;
    }
    lVar5 = 1;
    if (((ushort)(text[from + lVar2] + L'\xf0c0') < 0x80) &&
       (lVar5 = 1, ((ushort)text[from + lVar2] - 0xf40 & 0xfffffffc) < 0x2c)) {
      if (lVar1 < 2) {
        lVar1 = 1;
      }
      lVar4 = 1;
      uVar3 = 1;
      while ((lVar5 = lVar1, lVar1 != lVar4 &&
             (lVar5 = lVar4, (ushort)(text[from + lVar2 + lVar4] + L'\xf0c0') < 0x80))) {
        uVar6 = (uint)(byte)tibetanForm[(ushort)text[from + lVar2 + lVar4] - 0xf40];
        if ((byte)tibetanForm[(ushort)text[from + lVar2 + lVar4] - 0xf40] - 2 < 2) {
          uVar7 = uVar3 - 3;
          uVar3 = uVar6;
          if (uVar7 < 0xfffffffe) break;
        }
        else if (uVar6 == 4) {
          if (uVar3 - 4 < 0xfffffffd) break;
        }
        else if (uVar6 < 2) break;
        lVar4 = lVar4 + 1;
      }
    }
    attributes[lVar2 + from] = (QCharAttributes)((byte)attributes[lVar2 + from] | 1);
    lVar1 = lVar5 + lVar2;
    if (len <= lVar5 + lVar2) {
      lVar1 = len;
    }
    while (lVar2 = lVar2 + 1, lVar2 < lVar1) {
      attributes[lVar2 + from] = (QCharAttributes)((byte)attributes[lVar2 + from] & 0xfe);
    }
  } while( true );
}

Assistant:

static void tibetanAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    qsizetype i = 0;
    Q_UNUSED(script);
    attributes += from;
    while (i < len) {
        bool invalid;
        qsizetype boundary = tibetan_nextSyllableBoundary(text, from+i, end, &invalid) - from;

        attributes[i].graphemeBoundary = true;

        if (boundary > len-1) boundary = len;
        i++;
        while (i < boundary) {
            attributes[i].graphemeBoundary = false;
            ++i;
        }
        assert(i == boundary);
    }
}